

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerator::Logger::HeadLine_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,string_view title)

{
  char local_5a [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string_view title_local;
  
  title_local._M_str = (char *)title._M_len;
  local_5a[1] = 10;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  title_local._M_len = (size_t)this;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)this);
  local_5a[0] = '\n';
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char,std::__cxx11::string,char>
            (__return_storage_ptr__,&title_local,local_5a + 1,&local_58,local_5a);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::Logger::HeadLine(cm::string_view title)
{
  return cmStrCat(title, '\n', std::string(title.size(), '-'), '\n');
}